

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_reflection_setters
          (t_php_generator *this,ostringstream *out,string *field_name,string *cap_name)

{
  string *psVar1;
  ostream *poVar2;
  string local_b8;
  string local_98;
  string local_78;
  string local_48;
  string *local_28;
  string *cap_name_local;
  string *field_name_local;
  ostringstream *out_local;
  t_php_generator *this_local;
  
  local_28 = cap_name;
  cap_name_local = field_name;
  field_name_local = (string *)out;
  out_local = (ostringstream *)this;
  t_generator::indent_abi_cxx11_(&local_48,(t_generator *)this);
  poVar2 = std::operator<<(&out->super_basic_ostream<char,_std::char_traits<char>_>,
                           (string *)&local_48);
  poVar2 = std::operator<<(poVar2,"public function set");
  poVar2 = std::operator<<(poVar2,(string *)cap_name);
  poVar2 = std::operator<<(poVar2,"(");
  poVar2 = std::operator<<(poVar2,"$");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2,")");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_78);
  poVar2 = std::operator<<(poVar2,"{");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_48);
  t_generator::indent_up((t_generator *)this);
  psVar1 = field_name_local;
  t_generator::indent_abi_cxx11_(&local_98,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)psVar1,(string *)&local_98);
  poVar2 = std::operator<<(poVar2,"$this->");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2," = $");
  poVar2 = std::operator<<(poVar2,(string *)field_name);
  poVar2 = std::operator<<(poVar2,";");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  t_generator::indent_down((t_generator *)this);
  psVar1 = field_name_local;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar2 = std::operator<<((ostream *)psVar1,(string *)&local_b8);
  poVar2 = std::operator<<(poVar2,"}");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::operator<<((ostream *)field_name_local,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_php_generator::generate_reflection_setters(ostringstream& out,
						  string field_name,
						  string cap_name) {

  out << indent() << "public function set" << cap_name << "(" << "$" << field_name << ")" << endl
      << indent() << "{" << endl;

  indent_up();

  out << indent() << "$this->" << field_name << " = $" << field_name << ";" << endl;


  indent_down();
  out << indent() << "}" << endl;
  out << endl;
}